

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_http_compile_trailers(curl_slist *trailers,Curl_send_buffer *buffer,Curl_easy *handle)

{
  CURLcode CVar1;
  char *pcVar2;
  size_t size;
  char *local_48;
  char *endofline_network;
  char *endofline_native;
  CURLcode result;
  char *ptr;
  Curl_easy *handle_local;
  Curl_send_buffer *buffer_local;
  curl_slist *trailers_local;
  
  handle_local = (Curl_easy *)buffer;
  buffer_local = (Curl_send_buffer *)trailers;
  if (((*(ulong *)&(handle->set).field_0x878 >> 0xb & 1) == 0) &&
     ((*(ulong *)&(handle->set).field_0x878 >> 6 & 1) == 0)) {
    endofline_network = "\r\n";
    local_48 = "\r\n";
  }
  else {
    endofline_network = "\n";
    local_48 = "\n";
  }
  do {
    if (buffer_local == (Curl_send_buffer *)0x0) {
      size = strlen(local_48);
      CVar1 = Curl_add_buffer((Curl_send_buffer **)&handle_local,local_48,size);
      return CVar1;
    }
    pcVar2 = strchr(buffer_local->buffer,0x3a);
    if ((pcVar2 == (char *)0x0) || (pcVar2[1] != ' ')) {
      Curl_infof(handle,"Malformatted trailing header ! Skipping trailer.");
    }
    else {
      CVar1 = Curl_add_bufferf((Curl_send_buffer **)&handle_local,"%s%s",buffer_local->buffer,
                               endofline_network);
      if (CVar1 != CURLE_OK) {
        return CVar1;
      }
    }
    buffer_local = (Curl_send_buffer *)buffer_local->size_max;
  } while( true );
}

Assistant:

CURLcode Curl_http_compile_trailers(struct curl_slist *trailers,
                                    Curl_send_buffer *buffer,
                                    struct Curl_easy *handle)
{
  char *ptr = NULL;
  CURLcode result = CURLE_OK;
  const char *endofline_native = NULL;
  const char *endofline_network = NULL;

  if(
#ifdef CURL_DO_LINEEND_CONV
     (handle->set.prefer_ascii) ||
#endif
     (handle->set.crlf)) {
    /* \n will become \r\n later on */
    endofline_native  = "\n";
    endofline_network = "\x0a";
  }
  else {
    endofline_native  = "\r\n";
    endofline_network = "\x0d\x0a";
  }

  while(trailers) {
    /* only add correctly formatted trailers */
    ptr = strchr(trailers->data, ':');
    if(ptr && *(ptr + 1) == ' ') {
      result = Curl_add_bufferf(&buffer, "%s%s", trailers->data,
                                endofline_native);
      if(result)
        return result;
    }
    else
      infof(handle, "Malformatted trailing header ! Skipping trailer.");
    trailers = trailers->next;
  }
  result = Curl_add_buffer(&buffer, endofline_network,
                           strlen(endofline_network));
  return result;
}